

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coop_repository_basis.cpp
# Opt level: O0

initiate_deregistration_result_t __thiscall
so_5::impl::coop_repository_basis_t::initiate_deregistration(coop_repository_basis_t *this)

{
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lock;
  initiate_deregistration_result_t result;
  coop_repository_basis_t *this_local;
  
  lock._M_device._4_4_ = already_in_progress;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->m_coop_operations_lock);
  if ((this->m_deregistration_started & 1U) == 0) {
    this->m_deregistration_started = true;
    lock._M_device._4_4_ = initiated_first_time;
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return lock._M_device._4_4_;
}

Assistant:

coop_repository_basis_t::initiate_deregistration_result_t
coop_repository_basis_t::initiate_deregistration()
{
	initiate_deregistration_result_t result =
			initiate_deregistration_result_t::already_in_progress;
	{
		std::lock_guard< std::mutex > lock( m_coop_operations_lock );

		if( !m_deregistration_started )
		{
			m_deregistration_started = true;
			result = initiate_deregistration_result_t::initiated_first_time;
		}
	}

	return result;
}